

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_test.cpp
# Opt level: O0

void __thiscall check_dimension::test_method(check_dimension *this)

{
  allocator<unsigned_int> *this_00;
  initializer_list<unsigned_int> __l;
  initializer_list<double> __l_00;
  undefined8 uVar1;
  bool bVar2;
  size_t sVar3;
  lazy_ostream *prev;
  basic_cstring<const_char> local_1d0;
  basic_cstring<const_char> local_1c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1b0;
  assertion_result local_190;
  basic_cstring<const_char> local_178;
  basic_cstring<const_char> local_168;
  undefined1 local_158 [8];
  Bitmap_cubical_complex increasing;
  uint local_d0 [2];
  iterator local_c8;
  size_type local_c0;
  undefined1 local_b8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> dimensions;
  allocator<double> local_89;
  double local_88 [10];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<double,_std::allocator<double>_> increasingFiltrationOfTopDimensionalCells;
  check_dimension *this_local;
  
  local_88[8] = 9.0;
  local_88[6] = 7.0;
  local_88[7] = 8.0;
  local_88[4] = 5.0;
  local_88[5] = 6.0;
  local_88[2] = 3.0;
  local_88[3] = 4.0;
  local_88[0] = 1.0;
  local_88[1] = 2.0;
  local_38 = local_88;
  local_30 = 9;
  increasingFiltrationOfTopDimensionalCells.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<double>::allocator(&local_89);
  __l_00._M_len = local_30;
  __l_00._M_array = local_38;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_28,__l_00,&local_89);
  std::allocator<double>::~allocator(&local_89);
  local_d0[0] = 3;
  local_d0[1] = 3;
  local_c8 = local_d0;
  local_c0 = 2;
  this_00 = (allocator<unsigned_int> *)
            ((long)&increasing.sorted_cells.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_int>::allocator(this_00);
  __l._M_len = local_c0;
  __l._M_array = local_c8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8,__l,this_00);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&increasing.sorted_cells.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  Gudhi::cubical_complex::
  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
  Bitmap_cubical_complex
            ((Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_> *
             )local_158,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8,
             (vector<double,_std::allocator<double>_> *)local_28,true);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_168,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
               ,0x75);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_178);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_168,0x27,&local_178);
    sVar3 = Gudhi::cubical_complex::
            Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
            dimension((Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>
                       *)local_158);
    boost::test_tools::assertion_result::assertion_result(&local_190,sVar3 == 2);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1c0,"increasing.dimension() == 2",0x1b);
    boost::unit_test::operator<<(&local_1b0,prev,&local_1c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
               ,0x75);
    boost::test_tools::tt_detail::report_assertion(&local_190,&local_1b0,&local_1d0,0x27,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1b0);
    boost::test_tools::assertion_result::~assertion_result(&local_190);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::cubical_complex::
  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::
  ~Bitmap_cubical_complex
            ((Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_> *
             )local_158);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_28);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_dimension) {
  std::vector<double> increasingFiltrationOfTopDimensionalCells({1, 2, 3, 4, 5, 6, 7, 8, 9});

  std::vector<unsigned> dimensions({3, 3});

  Bitmap_cubical_complex increasing(dimensions, increasingFiltrationOfTopDimensionalCells);
  BOOST_CHECK(increasing.dimension() == 2);
}